

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LatencyEncodingSynapse.cpp
# Opt level: O2

void __thiscall LatencyEncodingSynapse::update(LatencyEncodingSynapse *this)

{
  VectorXd *this_00;
  double dVar1;
  Population *pPVar2;
  int iVar3;
  Scalar *pSVar4;
  SpikeEvent *this_01;
  Event *this_02;
  int j;
  ulong index;
  long index_00;
  double dVar5;
  double dVar6;
  
  this_00 = &this->spikeTimes;
  iVar3 = 0;
  do {
    if (this->inputSize <= iVar3) {
      return;
    }
    resetOutput(this);
    for (index = 0;
        (long)index <
        (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows; index = index + 1) {
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                          index);
      dVar6 = *pSVar4;
      dVar5 = Clock::getCurrentTime(this->clock);
      if (dVar5 < dVar6) {
LAB_0010b63f:
        this_02 = (Event *)operator_new(0x18);
        NoEvent::NoEvent((NoEvent *)this_02);
        (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
        super__Vector_impl_data._M_start[index] = this_02;
      }
      else {
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                            index);
        if (*pSVar4 <= -1.0) goto LAB_0010b63f;
        this_01 = (SpikeEvent *)operator_new(0x28);
        SpikeEvent::SpikeEvent(this_01);
        (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
        super__Vector_impl_data._M_start[index] = (Event *)this_01;
        (**(this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
           super__Vector_impl_data._M_start[index]->_vptr_Event)(0x4094500000000000);
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                            index);
        *pSVar4 = -1.0;
      }
      pPVar2 = (this->super_Synapse).to_population;
      (*pPVar2->_vptr_Population[5])
                (pPVar2,index & 0xffffffff,
                 (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                 super__Vector_impl_data._M_start[index]);
      Logging::logEvent(this->logger,(long)this,(int)index,
                        (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl
                        .super__Vector_impl_data._M_start[index]->type);
    }
    dVar6 = this->currentWindow;
    dVar5 = Clock::getCurrentTime(this->clock);
    if (dVar6 <= dVar5) {
      for (index_00 = 0;
          index_00 <
          (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows; index_00 = index_00 + 1) {
        dVar6 = this->param->window_length_s;
        dVar5 = ((double)(((this->super_Synapse).from_population)->output).
                         super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                         super__Vector_impl_data._M_start[index_00][1]._vptr_Event * 0.8 + 0.1) *
                dVar6;
        dVar6 = dVar6 * 0.9;
        if (dVar5 <= dVar6) {
          dVar6 = dVar5;
        }
        dVar1 = this->currentWindow;
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                            index_00);
        *pSVar4 = (double)(~-(ulong)(dVar5 < 0.0) & (ulong)dVar6) + dVar1;
      }
      this->currentWindow = this->param->window_length_s + this->currentWindow;
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void LatencyEncodingSynapse::update() {
    for(int i = 0; i < inputSize; i++) {
        resetOutput();
        for(int j = 0; j < spikeTimes.size(); j++) {
            if(spikeTimes(j) <= clock->getCurrentTime() && spikeTimes(j) > -1) {
                output[j] = new SpikeEvent();
                output[j]->setWeight(1300.0);
                spikeTimes(j) = -1;
            }
            else {
                output[j] = new NoEvent();
            }
            to_population->setInput(j, output[j]);
            logger->logEvent((long)this, j, output[j]->type);
        }
        if(currentWindow <= clock->getCurrentTime()) {
            for(int j = 0; j < spikeTimes.size(); j++) {
                double scaledValue = 0.1 + static_cast<ValueEvent*>(from_population->output[j])->value * 0.8;
                double vs = scaledValue * param->window_length_s;
                spikeTimes(j) = currentWindow + helperFunctions::clamp(vs, 0, param->window_length_s*0.9);
            }
            currentWindow += param->window_length_s;
        }
    }
}